

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

bool __thiscall Json::Reader::readArray(Reader *this,Token *tokenStart)

{
  iterator *piVar1;
  Value *pVVar2;
  bool bVar3;
  char *pcVar4;
  _Elt_pointer ppVVar5;
  _Elt_pointer ppVVar6;
  _Elt_pointer ppVVar7;
  byte *pbVar8;
  int index;
  byte bVar9;
  Token endArray;
  Token token;
  undefined1 local_90 [32];
  Token local_70;
  ValueHolder local_58;
  ushort local_50;
  undefined8 local_48;
  size_t local_40;
  size_t sStack_38;
  
  local_48 = 0;
  pcVar4 = (char *)operator_new(0x30);
  pcVar4[0x10] = '\0';
  pcVar4[0x11] = '\0';
  pcVar4[0x12] = '\0';
  pcVar4[0x13] = '\0';
  pcVar4[0x14] = '\0';
  pcVar4[0x15] = '\0';
  pcVar4[0x16] = '\0';
  pcVar4[0x17] = '\0';
  pcVar4[0x18] = '\0';
  pcVar4[0x19] = '\0';
  pcVar4[0x1a] = '\0';
  pcVar4[0x1b] = '\0';
  pcVar4[0x1c] = '\0';
  pcVar4[0x1d] = '\0';
  pcVar4[0x1e] = '\0';
  pcVar4[0x1f] = '\0';
  pcVar4[0] = '\0';
  pcVar4[1] = '\0';
  pcVar4[2] = '\0';
  pcVar4[3] = '\0';
  pcVar4[4] = '\0';
  pcVar4[5] = '\0';
  pcVar4[6] = '\0';
  pcVar4[7] = '\0';
  pcVar4[8] = '\0';
  pcVar4[9] = '\0';
  pcVar4[10] = '\0';
  pcVar4[0xb] = '\0';
  pcVar4[0xc] = '\0';
  pcVar4[0xd] = '\0';
  pcVar4[0xe] = '\0';
  pcVar4[0xf] = '\0';
  *(char **)(pcVar4 + 0x18) = pcVar4 + 8;
  *(char **)(pcVar4 + 0x20) = pcVar4 + 8;
  pcVar4[0x28] = '\0';
  pcVar4[0x29] = '\0';
  pcVar4[0x2a] = '\0';
  pcVar4[0x2b] = '\0';
  pcVar4[0x2c] = '\0';
  pcVar4[0x2d] = '\0';
  pcVar4[0x2e] = '\0';
  pcVar4[0x2f] = '\0';
  ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar5 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  pVVar2 = ppVVar5[-1];
  local_50 = *(ushort *)&pVVar2->field_0x8;
  local_58.map_ = *(ObjectValues **)&pVVar2->value_;
  (pVVar2->value_).string_ = pcVar4;
  *(ushort *)&pVVar2->field_0x8 = local_50 & 0xfe00 | 6;
  local_50 = local_50 & 0x1ff;
  local_40 = pVVar2->start_;
  sStack_38 = pVVar2->limit_;
  pVVar2->start_ = 0;
  pVVar2->limit_ = 0;
  Value::~Value((Value *)&local_58);
  ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  ppVVar6 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_first;
  ppVVar7 = ppVVar5;
  if (ppVVar5 == ppVVar6) {
    ppVVar7 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  ppVVar7[-1]->start_ = (long)tokenStart->start_ - (long)this->begin_;
  pbVar8 = (byte *)this->current_;
  while (pbVar8 != (byte *)this->end_) {
    bVar9 = *pbVar8;
    if ((0x20 < (ulong)bVar9) || ((0x100002600U >> ((ulong)bVar9 & 0x3f) & 1) == 0))
    goto LAB_0010d127;
    pbVar8 = pbVar8 + 1;
    this->current_ = (Location)pbVar8;
  }
  bVar9 = *pbVar8;
LAB_0010d127:
  if (bVar9 == 0x5d) {
    readToken(this,(Token *)local_90);
LAB_0010d13a:
    bVar3 = true;
  }
  else {
    index = 0;
    while( true ) {
      if (ppVVar5 == ppVVar6) {
        ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      local_90._0_8_ = Value::operator[](ppVVar5[-1],index);
      ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppVVar5 ==
          (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<Json::Value*,std::allocator<Json::Value*>>::_M_push_back_aux<Json::Value*>
                  ((deque<Json::Value*,std::allocator<Json::Value*>> *)this,(Value **)local_90);
      }
      else {
        *ppVVar5 = (Value *)local_90._0_8_;
        piVar1 = &(this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
      bVar3 = readValue(this);
      std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>::pop_back
                ((deque<Json::Value_*,_std::allocator<Json::Value_*>_> *)this);
      if (!bVar3) {
        recoverFromError(this,tokenArrayEnd);
        goto LAB_0010d238;
      }
      index = index + 1;
      do {
        readToken(this,&local_70);
      } while (local_70.type_ == tokenComment);
      if (local_70.type_ == tokenArrayEnd) goto LAB_0010d13a;
      if (local_70.type_ != tokenArraySeparator) break;
      ppVVar5 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      ppVVar6 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_first;
    }
    local_90._0_8_ = (Value *)(local_90 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_90,"Missing \',\' or \']\' in array declaration","");
    addError(this,(string *)local_90,&local_70,(Location)0x0);
    recoverFromError(this,tokenArrayEnd);
    if ((Value *)local_90._0_8_ != (Value *)(local_90 + 0x10)) {
      operator_delete((void *)local_90._0_8_);
    }
LAB_0010d238:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Reader::readArray(Token& tokenStart) {
  currentValue() = Value(arrayValue);
  currentValue().setOffsetStart(tokenStart.start_ - begin_);
  skipSpaces();
  if (*current_ == ']') // empty array
  {
    Token endArray;
    readToken(endArray);
    return true;
  }
  int index = 0;
  for (;;) {
    Value& value = currentValue()[index++];
    nodes_.push(&value);
    bool ok = readValue();
    nodes_.pop();
    if (!ok) // error already set
      return recoverFromError(tokenArrayEnd);

    Token token;
    // Accept Comment after last item in the array.
    ok = readToken(token);
    while (token.type_ == tokenComment && ok) {
      ok = readToken(token);
    }
    bool badTokenType =
        (token.type_ != tokenArraySeparator && token.type_ != tokenArrayEnd);
    if (!ok || badTokenType) {
      return addErrorAndRecover(
          "Missing ',' or ']' in array declaration", token, tokenArrayEnd);
    }
    if (token.type_ == tokenArrayEnd)
      break;
  }
  return true;
}